

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::FieldOptions_FeatureSupport::ByteSizeLong(FieldOptions_FeatureSupport *this)

{
  uint uVar1;
  Edition EVar2;
  uint32_t *puVar3;
  string *value;
  size_t sVar4;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  FieldOptions_FeatureSupport *this_;
  FieldOptions_FeatureSupport *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = 0;
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  puVar3 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar3;
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      value = _internal_deprecation_warning_abi_cxx11_(this);
      sStack_58 = internal::WireFormatLite::StringSize(value);
      sStack_58 = sStack_58 + 1;
    }
    if ((uVar1 & 2) != 0) {
      EVar2 = _internal_edition_introduced(this);
      sVar4 = internal::WireFormatLite::EnumSize(EVar2);
      sStack_58 = sVar4 + 1 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      EVar2 = _internal_edition_deprecated(this);
      sVar4 = internal::WireFormatLite::EnumSize(EVar2);
      sStack_58 = sVar4 + 1 + sStack_58;
    }
    if ((uVar1 & 8) != 0) {
      EVar2 = _internal_edition_removed(this);
      sVar4 = internal::WireFormatLite::EnumSize(EVar2);
      sStack_58 = sVar4 + 1 + sStack_58;
    }
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t FieldOptions_FeatureSupport::ByteSizeLong() const {
  const FieldOptions_FeatureSupport& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FieldOptions.FeatureSupport)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    // optional string deprecation_warning = 3;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_deprecation_warning());
    }
    // optional .google.protobuf.Edition edition_introduced = 1;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_edition_introduced());
    }
    // optional .google.protobuf.Edition edition_deprecated = 2;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_edition_deprecated());
    }
    // optional .google.protobuf.Edition edition_removed = 4;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_edition_removed());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}